

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void update_mem_loc_alloca_flag(gen_ctx_t gen_ctx,size_t nloc,int flag)

{
  byte bVar1;
  VARR_mem_attr_t *pVVar2;
  char *pcVar3;
  
  pVVar2 = gen_ctx->mem_attrs;
  if (pVVar2 == (VARR_mem_attr_t *)0x0) {
    update_mem_loc_alloca_flag_cold_1();
  }
  else if (nloc < pVVar2->els_num) {
    bVar1 = pVVar2->varr[nloc].alloca_flag;
    pVVar2->varr[nloc].alloca_flag = (byte)flag & bVar1 & 2 | (bVar1 | (byte)flag) & 1;
    if ((((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) &&
       ((uint)bVar1 != flag)) {
      fprintf((FILE *)gen_ctx->debug_file,"    m%lu ");
      if (flag != 0) {
        pcVar3 = "may/must";
        if ((flag & 3U) == 0) {
          pcVar3 = "must";
        }
        fprintf((FILE *)gen_ctx->debug_file,"becomes %s alloca based\n",pcVar3);
        return;
      }
      fwrite("is no more alloca based\n",0x18,1,(FILE *)gen_ctx->debug_file);
      return;
    }
    return;
  }
  __assert_fail("(VARR_mem_attr_tlength (gen_ctx->mem_attrs)) > nloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x103a,"void update_mem_loc_alloca_flag(gen_ctx_t, size_t, int)");
}

Assistant:

static void update_mem_loc_alloca_flag (gen_ctx_t gen_ctx, size_t nloc, int flag) {
  int old_flag;
  mem_attr_t *mem_attr_ref;

  gen_assert (VARR_LENGTH (mem_attr_t, mem_attrs) > nloc);
  mem_attr_ref = &VARR_ADDR (mem_attr_t, mem_attrs)[nloc];
  old_flag = mem_attr_ref->alloca_flag;
  mem_attr_ref->alloca_flag = ((old_flag | flag) & MAY_ALLOCA) | (old_flag & flag & MUST_ALLOCA);
  DEBUG (2, {
    if (flag != old_flag) {
      fprintf (debug_file, "    m%lu ", (unsigned long) nloc);
      if (!flag)
        fprintf (debug_file, "is no more alloca based\n");
      else
        fprintf (debug_file, "becomes %s alloca based\n",
                 flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
                 : flag & MAY_ALLOCA               ? "may"
                                                   : "must");
    }
  });
}